

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

page_collection *
page_collection_lock_arm(uc_struct_conflict1 *uc,tb_page_addr_t start,tb_page_addr_t end)

{
  PageDesc *pPVar1;
  _Bool _Var2;
  page_collection *set_00;
  PageDesc *pPVar3;
  PageDesc *pPVar4;
  GTree *pGVar5;
  PageDesc *pPVar6;
  uint local_44;
  ulong uStack_40;
  int n;
  TranslationBlock_conflict *tb;
  PageDesc *pd;
  tb_page_addr_t index;
  page_collection *set;
  tb_page_addr_t end_local;
  tb_page_addr_t start_local;
  uc_struct_conflict1 *uc_local;
  
  set_00 = (page_collection *)g_malloc(0x10);
  pPVar3 = (PageDesc *)(start >> ((byte)uc->init_target_page->bits & 0x3f));
  pPVar4 = (PageDesc *)(end >> ((byte)uc->init_target_page->bits & 0x3f));
  if (pPVar4 < pPVar3) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
               ,0x293,"start <= end");
  }
  pGVar5 = g_tree_new_full(tb_page_addr_cmp,(gpointer)0x0,(GDestroyNotify)0x0,page_entry_destroy);
  set_00->tree = pGVar5;
  set_00->max = (page_entry *)0x0;
  assert_no_pages_locked();
  pPVar1 = pPVar3;
LAB_005dfe8b:
  pd = pPVar1;
  if (pPVar4 < pd) {
    return set_00;
  }
  pPVar6 = page_find(uc,(tb_page_addr_t)pd);
  if (pPVar6 != (PageDesc *)0x0) goto LAB_005dfeb6;
  goto LAB_005dff78;
LAB_005dfeb6:
  _Var2 = page_trylock_add(uc,set_00,(long)pd << ((byte)uc->init_target_page->bits & 0x3f));
  pPVar1 = pPVar3;
  if (!_Var2) {
    local_44 = (uint)pPVar6->first_tb;
    uStack_40 = pPVar6->first_tb;
    while( true ) {
      uStack_40 = uStack_40 & 0xfffffffffffffffe;
      local_44 = local_44 & 1;
      if (uStack_40 == 0) break;
      _Var2 = page_trylock_add(uc,set_00,*(tb_page_addr_t *)(uStack_40 + 0x40));
      if ((_Var2) ||
         ((*(long *)(uStack_40 + 0x48) != -1 &&
          (_Var2 = page_trylock_add(uc,set_00,*(tb_page_addr_t *)(uStack_40 + 0x48)), _Var2))))
      goto LAB_005dfe8b;
      uStack_40 = *(ulong *)(uStack_40 + 0x30 + (long)(int)local_44 * 8);
      local_44 = (uint)uStack_40;
    }
LAB_005dff78:
    pPVar1 = (PageDesc *)((long)&pd->first_tb + 1);
  }
  goto LAB_005dfe8b;
}

Assistant:

struct page_collection *
page_collection_lock(struct uc_struct *uc, tb_page_addr_t start, tb_page_addr_t end)
{
    struct page_collection *set = g_malloc(sizeof(*set));
    tb_page_addr_t index;
    PageDesc *pd;

    start >>= TARGET_PAGE_BITS;
    end   >>= TARGET_PAGE_BITS;
    g_assert(start <= end);

    set->tree = g_tree_new_full(tb_page_addr_cmp, NULL, NULL,
                                page_entry_destroy);
    set->max = NULL;
    assert_no_pages_locked();

 retry:
#if 0
    g_tree_foreach(set->tree, page_entry_lock, NULL);
#endif

    for (index = start; index <= end; index++) {
        TranslationBlock *tb;
        int n;

        pd = page_find(uc, index);
        if (pd == NULL) {
            continue;
        }
        if (page_trylock_add(uc, set, index << TARGET_PAGE_BITS)) {
#if 0
            g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
            goto retry;
        }
        assert_page_locked(pd);
        PAGE_FOR_EACH_TB(pd, tb, n) {
            if (page_trylock_add(uc, set, tb->page_addr[0]) ||
                (tb->page_addr[1] != -1 &&
                 page_trylock_add(uc, set, tb->page_addr[1]))) {
                /* drop all locks, and reacquire in order */
#if 0
                g_tree_foreach(set->tree, page_entry_unlock, NULL);
#endif
                goto retry;
            }
        }
    }
    return set;
}